

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_encode_file(char *filename,uchar *image,uint w,uint h,LodePNGColorType colortype,
                        uint bitdepth)

{
  uint local_3c;
  size_t sStack_38;
  uint error;
  size_t buffersize;
  uchar *buffer;
  uint bitdepth_local;
  LodePNGColorType colortype_local;
  uint h_local;
  uint w_local;
  uchar *image_local;
  char *filename_local;
  
  buffer._0_4_ = bitdepth;
  buffer._4_4_ = colortype;
  bitdepth_local = h;
  colortype_local = w;
  _h_local = image;
  image_local = (uchar *)filename;
  local_3c = lodepng_encode_memory
                       ((uchar **)&buffersize,&stack0xffffffffffffffc8,image,w,h,colortype,bitdepth)
  ;
  if (local_3c == 0) {
    local_3c = lodepng_save_file((uchar *)buffersize,sStack_38,(char *)image_local);
  }
  lodepng_free((void *)buffersize);
  return local_3c;
}

Assistant:

unsigned lodepng_encode_file(const char* filename, const unsigned char* image, unsigned w, unsigned h,
                             LodePNGColorType colortype, unsigned bitdepth) {
  unsigned char* buffer;
  size_t buffersize;
  unsigned error = lodepng_encode_memory(&buffer, &buffersize, image, w, h, colortype, bitdepth);
  if(!error) error = lodepng_save_file(buffer, buffersize, filename);
  lodepng_free(buffer);
  return error;
}